

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

void __thiscall
cmCTestSubmitHandler::ParseResponse
          (cmCTestSubmitHandler *this,cmCTestSubmitHandlerVectorOfChar *chunk)

{
  cmCTest *pcVar1;
  iterator __first;
  iterator __last;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type length;
  string local_488 [32];
  cmCTestLogWrite local_468;
  undefined1 local_458 [8];
  ostringstream cmCTestLog_msg_1;
  string local_2e0;
  uint local_2bc;
  string local_2b8 [32];
  undefined1 local_298 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_120 [8];
  ResponseParser parser;
  undefined1 local_38 [8];
  string output;
  cmCTestSubmitHandlerVectorOfChar *chunk_local;
  cmCTestSubmitHandler *this_local;
  
  output.field_2._8_8_ = chunk;
  std::__cxx11::string::string((string *)local_38);
  __first = std::vector<char,_std::allocator<char>_>::begin(chunk);
  __last = std::vector<char,_std::allocator<char>_>::end(chunk);
  std::__cxx11::string::
  append<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)local_38,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             __first._M_current,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)__last._M_current
            );
  lVar2 = std::__cxx11::string::find(local_38,0x9229a7);
  if (lVar2 != -1) {
    ResponseParser::ResponseParser((ResponseParser *)local_120);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmXMLParser::Parse((cmXMLParser *)local_120,pcVar3);
    if ((int)parser.super_cmXMLParser.Parser == 0) {
      cmCTest::SetBuildID((this->super_cmCTestGenericHandler).CTest,
                          (string *)((long)&parser.Message.field_2 + 8));
    }
    else {
      this->HasErrors = true;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      poVar4 = std::operator<<((ostream *)local_298,"   Submission failed: ");
      poVar4 = std::operator<<(poVar4,(string *)(parser.MD5.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x1d2,pcVar3,false);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    }
    local_2bc = (uint)((int)parser.super_cmXMLParser.Parser != 0);
    ResponseParser::~ResponseParser((ResponseParser *)local_120);
    if (local_2bc != 0) goto LAB_001d8d62;
  }
  cmsys::SystemTools::UpperCase(&local_2e0,(string *)local_38);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  lVar2 = std::__cxx11::string::find(local_38,0x91df5f);
  if (lVar2 != -1) {
    this->HasWarnings = true;
  }
  lVar2 = std::__cxx11::string::find(local_38,0x981e72);
  if (lVar2 != -1) {
    this->HasErrors = true;
  }
  if (((this->HasWarnings & 1U) != 0) || ((this->HasErrors & 1U) != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
    poVar4 = std::operator<<((ostream *)local_458,"   Server Response:\n");
    pcVar3 = std::vector<char,_std::allocator<char>_>::data(chunk);
    length = std::vector<char,_std::allocator<char>_>::size(chunk);
    cmCTestLogWrite::cmCTestLogWrite(&local_468,pcVar3,length);
    poVar4 = ::operator<<(poVar4,&local_468);
    std::operator<<(poVar4,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1e2,pcVar3,false);
    std::__cxx11::string::~string(local_488);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  }
  local_2bc = 0;
LAB_001d8d62:
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCTestSubmitHandler::ParseResponse(
  cmCTestSubmitHandlerVectorOfChar chunk)
{
  std::string output;
  output.append(chunk.begin(), chunk.end());

  if (output.find("<cdash") != std::string::npos) {
    ResponseParser parser;
    parser.Parse(output.c_str());

    if (parser.Status != ResponseParser::STATUS_OK) {
      this->HasErrors = true;
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "   Submission failed: " << parser.Message << std::endl);
      return;
    }
    this->CTest->SetBuildID(parser.BuildID);
  }
  output = cmSystemTools::UpperCase(output);
  if (output.find("WARNING") != std::string::npos) {
    this->HasWarnings = true;
  }
  if (output.find("ERROR") != std::string::npos) {
    this->HasErrors = true;
  }

  if (this->HasWarnings || this->HasErrors) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Server Response:\n"
                 << cmCTestLogWrite(chunk.data(), chunk.size()) << "\n");
  }
}